

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

void helper_sve_splice_aarch64(void *vd,void *vn,void *vm,void *vg,uint32_t desc)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uintptr_t d;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uintptr_t s;
  size_t __n;
  uintptr_t s_1;
  ARMVectorReg_conflict tmp;
  
  uVar2 = (desc & 0x1f) * 8 + 8;
  uVar6 = (ulong)((uVar2 >> 3) + 7 & 0xfffffff8);
  uVar8 = 0;
  uVar7 = 0;
  uVar5 = 0;
  uVar4 = 0;
  while (7 < (long)uVar6) {
    uVar1 = uVar6 - 8;
    uVar9 = *(ulong *)((long)vg + (uVar6 - 8)) & pred_esz_masks_aarch64[(int)desc >> 10];
    uVar6 = uVar1;
    if ((uVar9 != 0) && (uVar8 = uVar1, uVar7 = uVar9, uVar5 == 0)) {
      uVar5 = uVar9;
      uVar4 = uVar1;
    }
  }
  if (uVar7 == 0) {
    __n = 0;
  }
  else {
    lVar3 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    lVar3 = lVar3 + uVar8 * 8;
    if (uVar5 == 0) {
      uVar6 = 0x40;
    }
    else {
      uVar6 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x3f;
    }
    __n = (((1L << ((byte)((int)desc >> 10) & 0x3f)) + uVar4 * 8) - (uVar6 + lVar3)) + 0x3f;
    if (vd == vm) {
      memcpy(&tmp,vm,(ulong)uVar2);
      vm = &tmp;
    }
    memmove(vd,(void *)((long)vn + lVar3),__n);
  }
  memmove((void *)((long)vd + __n),vm,uVar2 - __n);
  return;
}

Assistant:

void HELPER(sve_splice)(void *vd, void *vn, void *vm, void *vg, uint32_t desc)
{
    intptr_t opr_sz = simd_oprsz(desc) / 8;
    int esz = simd_data(desc);
    uint64_t pg, first_g, last_g, len, mask = pred_esz_masks[esz];
    intptr_t i, first_i, last_i;
    ARMVectorReg tmp;

    first_i = last_i = 0;
    first_g = last_g = 0;

    /* Find the extent of the active elements within VG.  */
    for (i = QEMU_ALIGN_UP(opr_sz, 8) - 8; i >= 0; i -= 8) {
        pg = *(uint64_t *)((char *)vg + i) & mask;
        if (pg) {
            if (last_g == 0) {
                last_g = pg;
                last_i = i;
            }
            first_g = pg;
            first_i = i;
        }
    }

    len = 0;
    if (first_g != 0) {
        first_i = first_i * 8 + ctz64(first_g);
        last_i = last_i * 8 + 63 - clz64(last_g);
        len = last_i - first_i + (1ULL << esz);
        if (vd == vm) {
            vm = memcpy(&tmp, vm, opr_sz * 8);
        }
        swap_memmove(vd, (char *)vn + first_i, len);
    }
    swap_memmove((char *)vd + len, vm, opr_sz * 8 - len);
}